

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

Gia_Man_t *
Gia_ManIsoReduce2(Gia_Man_t *pGia,Vec_Ptr_t **pvPosEquivs,Vec_Ptr_t **pvPiPerms,int fEstimate,
                 int fBetterQual,int fDualOut,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Wec_t *p;
  abctime aVar5;
  Gia_Man_t *pGVar6;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_01;
  Vec_Ptr_t *p_02;
  int *Entry;
  void *__dest;
  abctime time;
  abctime time_00;
  int i;
  size_t __size;
  char *pcVar8;
  int iVar9;
  int nUsedPos;
  Vec_Ptr_t **local_40;
  Vec_Ptr_t **local_38;
  
  local_40 = pvPosEquivs;
  local_38 = pvPiPerms;
  aVar4 = Abc_Clock();
  p = Gia_Iso2ManPerform(pGia,fVeryVerbose);
  uVar1 = Vec_WecCountNonTrivial(p,&nUsedPos);
  pcVar8 = (char *)(ulong)(uint)(pGia->vCos->nSize - pGia->nRegs);
  printf("Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  "
         ,pcVar8,(ulong)(uint)p->nSize,(ulong)(uint)nUsedPos,(ulong)uVar1);
  aVar5 = Abc_Clock();
  Abc_PrintTime((int)aVar5 - (int)aVar4,pcVar8,time);
  if (fEstimate != 0) {
    Vec_WecFree(p);
    pGVar6 = Gia_ManDup(pGia);
    return pGVar6;
  }
  if (fBetterQual == 0) {
    p_00 = Gia_Iso2ManCheckIsoClassesSkip(pGia,p);
  }
  else {
    p_00 = Gia_Iso2ManCheckIsoClasses(pGia,p);
  }
  Vec_WecFree(p);
  qsort(p_00->pArray,(long)p_00->nSize,0x10,Vec_WecSortCompare3);
  pVVar7 = Vec_IntAlloc(p_00->nSize);
  for (iVar9 = 0; iVar9 < p_00->nSize; iVar9 = iVar9 + 1) {
    p_01 = Vec_WecEntry(p_00,iVar9);
    if (0 < p_01->nSize) {
      iVar2 = Vec_IntEntry(p_01,0);
      Vec_IntPush(pVVar7,iVar2);
    }
  }
  pGVar6 = Gia_ManDupCones(pGia,pVVar7->pArray,pVVar7->nSize,0);
  Vec_IntFree(pVVar7);
  uVar1 = Vec_WecCountNonTrivial(p_00,&nUsedPos);
  pcVar8 = (char *)(ulong)(uint)(pGia->vCos->nSize - pGia->nRegs);
  printf("Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  "
         ,pcVar8,(ulong)(uint)p_00->nSize,(ulong)(uint)nUsedPos,(ulong)uVar1);
  aVar5 = Abc_Clock();
  Abc_PrintTime((int)aVar5 - (int)aVar4,pcVar8,time_00);
  if (fVerbose != 0) {
    puts("Nontrivial classes:");
    for (uVar1 = 0; (int)uVar1 < p_00->nSize; uVar1 = uVar1 + 1) {
      pVVar7 = Vec_WecEntry(p_00,uVar1);
      if (pVVar7->nSize != 1) {
        printf(" %4d : {",(ulong)uVar1);
        for (iVar9 = 0; iVar9 < pVVar7->nSize; iVar9 = iVar9 + 1) {
          uVar3 = Vec_IntEntry(pVVar7,iVar9);
          printf(" %d",(ulong)uVar3);
        }
        puts(" }");
      }
    }
  }
  if (local_38 != (Vec_Ptr_t **)0x0) {
    *local_38 = (Vec_Ptr_t *)0x0;
  }
  if (local_40 != (Vec_Ptr_t **)0x0) {
    p_02 = Vec_PtrAlloc(p_00->nSize);
    for (iVar9 = 0; iVar9 < p_00->nSize; iVar9 = iVar9 + 1) {
      pVVar7 = Vec_WecEntry(p_00,iVar9);
      Entry = (int *)malloc(0x10);
      iVar2 = pVVar7->nSize;
      Entry[1] = iVar2;
      *Entry = iVar2;
      if ((long)iVar2 == 0) {
        __size = 0;
        __dest = (void *)0x0;
      }
      else {
        __size = (long)iVar2 << 2;
        __dest = malloc(__size);
      }
      *(void **)(Entry + 2) = __dest;
      memcpy(__dest,pVVar7->pArray,__size);
      Vec_PtrPush(p_02,Entry);
    }
    *local_40 = p_02;
  }
  Vec_WecFree(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManIsoReduce2( Gia_Man_t * pGia, Vec_Ptr_t ** pvPosEquivs, Vec_Ptr_t ** pvPiPerms, int fEstimate, int fBetterQual, int fDualOut, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pPart;
    Vec_Wec_t * vEquivs, * vEquivs2;
    Vec_Int_t * vRemains;
    int nClasses, nUsedPos;
    abctime clk = Abc_Clock();
    vEquivs = Gia_Iso2ManPerform( pGia, fVeryVerbose );
    // report class stats
    nClasses = Vec_WecCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(pGia), Vec_WecSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fEstimate )
    {
        Vec_WecFree( vEquivs );
        return Gia_ManDup(pGia);
    }
    // verify classes
    if ( fBetterQual )
        vEquivs2 = Gia_Iso2ManCheckIsoClasses( pGia, vEquivs );
    else
        vEquivs2 = Gia_Iso2ManCheckIsoClassesSkip( pGia, vEquivs );
    Vec_WecFree( vEquivs );
    vEquivs = vEquivs2;
    // sort equiv classes by the first integer
    Vec_WecSortByFirstInt( vEquivs, 0 );
    // find the first outputs
    vRemains = Vec_WecCollectFirsts( vEquivs );
    // derive the final GIA
    pPart = Gia_ManDupCones( pGia, Vec_IntArray(vRemains), Vec_IntSize(vRemains), 0 );
    Vec_IntFree( vRemains );
    // report class stats
    nClasses = Vec_WecCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(pGia), Vec_WecSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vEquivs, 1 );
    }
    if ( pvPiPerms )
        *pvPiPerms = NULL;
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vEquivs );
    Vec_WecFree( vEquivs );
//    Gia_ManStopP( &pPart );
    return pPart;
}